

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void process_first_pass_stats(AV1_COMP *cpi,FIRSTPASS_STATS *this_frame)

{
  double *pdVar1;
  AV1_PRIMARY *pAVar2;
  FIRSTPASS_STATS *pFVar3;
  int iVar4;
  STATS_BUFFER_CTX *pSVar5;
  AV1_PRIMARY *pAVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  pAVar2 = cpi->ppi;
  pSVar5 = (pAVar2->twopass).stats_buf_ctx;
  if (((((cpi->oxcf).rc_cfg.mode == AOM_Q) || ((cpi->common).current_frame.frame_number != 0)) ||
      (cpi->gf_frame_index != '\0')) ||
     ((pSVar5->total_stats == (FIRSTPASS_STATS *)0x0 ||
      (pSVar5->total_left_stats == (FIRSTPASS_STATS *)0x0)))) goto LAB_001f827d;
  pAVar6 = pAVar2;
  if (pAVar2->lap_enabled == 0) {
LAB_001f835a:
    uVar7 = (pAVar6->twopass).bits_left /
            (long)(int)(((pAVar6->twopass).stats_buf_ctx)->total_stats->count -
                       (double)(cpi->common).current_frame.frame_number);
    uVar8 = 0x7fffffff;
    if ((long)uVar7 < 0x7fffffff) {
      uVar8 = uVar7;
    }
  }
  else {
    memcpy(pSVar5->total_left_stats,pSVar5->total_stats,0xe8);
    pAVar6 = cpi->ppi;
    if (pAVar6->lap_enabled == 0) goto LAB_001f835a;
    uVar8 = (ulong)(uint)(cpi->rc).avg_frame_bandwidth;
  }
  pFVar3 = ((pAVar2->twopass).stats_buf_ctx)->total_left_stats;
  dVar9 = pFVar3->count;
  iVar4 = get_twopass_worst_quality
                    (cpi,pFVar3->coded_error / dVar9,
                     (pFVar3->inactive_zone_rows + pFVar3->inactive_zone_rows) /
                     ((double)(cpi->common).mi_params.mb_rows * dVar9) +
                     pFVar3->intra_skip_pct / dVar9,(int)uVar8);
  (cpi->rc).active_worst_quality = iVar4;
  (cpi->rc).ni_av_qi = iVar4;
  (pAVar2->p_rc).last_q[1] = iVar4;
  dVar9 = av1_convert_qindex_to_q(iVar4,((cpi->common).seq_params)->bit_depth);
  (pAVar2->p_rc).avg_q = dVar9;
  (pAVar2->p_rc).avg_frame_qindex[1] = iVar4;
  iVar4 = (iVar4 + (cpi->oxcf).rc_cfg.best_allowed_q) / 2;
  (pAVar2->p_rc).last_q[0] = iVar4;
  (pAVar2->p_rc).avg_frame_qindex[0] = iVar4;
  pSVar5 = (pAVar2->twopass).stats_buf_ctx;
LAB_001f827d:
  pFVar3 = (cpi->twopass_frame).stats_in;
  if (pFVar3 < pSVar5->stats_in_end) {
    memcpy(this_frame,pFVar3,0xe8);
    (cpi->twopass_frame).stats_in = (cpi->twopass_frame).stats_in + 1;
  }
  else if (this_frame == (FIRSTPASS_STATS *)0x0) {
    return;
  }
  dVar9 = log1p(this_frame->intra_error);
  (cpi->twopass_frame).mb_av_energy = dVar9;
  pdVar1 = &((cpi->ppi->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy;
  if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
    dVar9 = log1p(this_frame->frame_avg_wavelet_energy);
    (cpi->twopass_frame).frame_avg_haar_energy = dVar9;
  }
  (cpi->twopass_frame).fr_content_type = 0.15 <= this_frame->intra_skip_pct;
  return;
}

Assistant:

static void process_first_pass_stats(AV1_COMP *cpi,
                                     FIRSTPASS_STATS *this_frame) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FIRSTPASS_STATS *total_stats = twopass->stats_buf_ctx->total_stats;

  if (cpi->oxcf.rc_cfg.mode != AOM_Q && current_frame->frame_number == 0 &&
      cpi->gf_frame_index == 0 && total_stats &&
      twopass->stats_buf_ctx->total_left_stats) {
    if (cpi->ppi->lap_enabled) {
      /*
       * Accumulate total_stats using available limited number of stats,
       * and assign it to total_left_stats.
       */
      *twopass->stats_buf_ctx->total_left_stats = *total_stats;
    }
    // Special case code for first frame.
    const int section_target_bandwidth = get_section_target_bandwidth(cpi);
    const double section_length =
        twopass->stats_buf_ctx->total_left_stats->count;
    const double section_error =
        twopass->stats_buf_ctx->total_left_stats->coded_error / section_length;
    const double section_intra_skip =
        twopass->stats_buf_ctx->total_left_stats->intra_skip_pct /
        section_length;
    const double section_inactive_zone =
        (twopass->stats_buf_ctx->total_left_stats->inactive_zone_rows * 2) /
        ((double)cm->mi_params.mb_rows * section_length);
    const int tmp_q = get_twopass_worst_quality(
        cpi, section_error, section_intra_skip + section_inactive_zone,
        section_target_bandwidth);

    rc->active_worst_quality = tmp_q;
    rc->ni_av_qi = tmp_q;
    p_rc->last_q[INTER_FRAME] = tmp_q;
    p_rc->avg_q = av1_convert_qindex_to_q(tmp_q, cm->seq_params->bit_depth);
    p_rc->avg_frame_qindex[INTER_FRAME] = tmp_q;
    p_rc->last_q[KEY_FRAME] = (tmp_q + cpi->oxcf.rc_cfg.best_allowed_q) / 2;
    p_rc->avg_frame_qindex[KEY_FRAME] = p_rc->last_q[KEY_FRAME];
  }

  if (cpi->twopass_frame.stats_in < twopass->stats_buf_ctx->stats_in_end) {
    *this_frame = *cpi->twopass_frame.stats_in;
    ++cpi->twopass_frame.stats_in;
  }
  set_twopass_params_based_on_fp_stats(cpi, this_frame);
}